

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O0

void __thiscall
soplex::SLUFactor<double>::solveLeft
          (SLUFactor<double> *this,VectorBase<double> *x,VectorBase<double> *b)

{
  double *vec;
  CLUFactor<double> *in_RDI;
  VectorBase<double> *in_stack_ffffffffffffffc8;
  VectorBase<double> *in_stack_ffffffffffffffd0;
  pointer *rhs;
  
  (**(code **)(*(long *)in_RDI[1].u.row.idx + 0x18))();
  VectorBase<double>::operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  VectorBase<double>::clear((VectorBase<double> *)in_RDI);
  rhs = (pointer *)&in_RDI->initMaxabs;
  vec = VectorBase<double>::get_ptr((VectorBase<double> *)0x289f42);
  VectorBase<double>::get_ptr((VectorBase<double> *)0x289f58);
  CLUFactor<double>::solveLeft(in_RDI,vec,(double *)rhs);
  *(int *)((long)&in_RDI[1].u.row.start + 4) = *(int *)((long)&in_RDI[1].u.row.start + 4) + 1;
  (**(code **)(*(long *)in_RDI[1].u.row.idx + 0x20))();
  return;
}

Assistant:

void SLUFactor<R>::solveLeft(VectorBase<R>& x, const VectorBase<R>& b) //const
{

   solveTime->start();

   vec = b;
   x.clear();
   CLUFactor<R>::solveLeft(x.get_ptr(), vec.get_ptr());

   solveCount++;
   solveTime->stop();
}